

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O3

uint32_t __thiscall
llvm::DWARFDebugLine::LineTable::lookupAddressImpl(LineTable *this,SectionedAddress Address)

{
  Sequence *pSVar1;
  uint32_t uVar2;
  difference_type __d;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  Sequence *Seq;
  undefined1 local_50 [8];
  Sequence Sequence;
  
  uVar5 = Address.SectionIndex;
  DWARFDebugLine::Sequence::Sequence((Sequence *)local_50);
  Seq = (this->Sequences).
        super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->Sequences).
           super__Vector_base<llvm::DWARFDebugLine::Sequence,_std::allocator<llvm::DWARFDebugLine::Sequence>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar3 = (long)pSVar1 - (long)Seq;
  if (0 < (long)uVar3) {
    uVar3 = (uVar3 >> 3) * -0x3333333333333333;
    do {
      uVar4 = uVar3 >> 1;
      if ((Seq[uVar4].SectionIndex <= uVar5) &&
         ((Seq[uVar4].SectionIndex < uVar5 || (Seq[uVar4].HighPC <= Address.Address)))) {
        Seq = Seq + uVar4 + 1;
        uVar4 = ~uVar4 + uVar3;
      }
      uVar3 = uVar4;
    } while (0 < (long)uVar4);
  }
  if ((Seq == pSVar1) || (Seq->SectionIndex != uVar5)) {
    uVar2 = this->UnknownRowIndex;
  }
  else {
    Sequence.LowPC = Address.Address;
    Sequence.HighPC = uVar5;
    uVar2 = findRowInSeq(this,Seq,Address);
  }
  return uVar2;
}

Assistant:

uint32_t DWARFDebugLine::LineTable::lookupAddressImpl(
    object::SectionedAddress Address) const {
  // First, find an instruction sequence containing the given address.
  DWARFDebugLine::Sequence Sequence;
  Sequence.SectionIndex = Address.SectionIndex;
  Sequence.HighPC = Address.Address;
  SequenceIter It = llvm::upper_bound(Sequences, Sequence,
                                      DWARFDebugLine::Sequence::orderByHighPC);
  if (It == Sequences.end() || It->SectionIndex != Address.SectionIndex)
    return UnknownRowIndex;
  return findRowInSeq(*It, Address);
}